

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockTests.cpp
# Opt level: O0

void __thiscall
vkt::ubo::anon_unknown_0::BlockSingleStructCase::BlockSingleStructCase
          (BlockSingleStructCase *this,TestContext *testCtx,string *name,string *description,
          deUint32 layoutFlags,BufferMode bufferMode,int numInstances,MatrixLoadFlags matrixLoadFlag
          )

{
  StructType *pSVar1;
  UniformBlock *pUVar2;
  allocator<char> local_219;
  string local_218;
  VarType local_1f8;
  allocator<char> local_1d9;
  string local_1d8;
  Uniform local_1b8;
  allocator<char> local_171;
  string local_170;
  UniformBlock *local_150;
  UniformBlock *block;
  allocator<char> local_129;
  string local_128;
  VarType local_108;
  VarType local_f0;
  allocator<char> local_d1;
  string local_d0;
  VarType local_b0;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  StructType *local_38;
  StructType *typeS;
  BufferMode bufferMode_local;
  deUint32 layoutFlags_local;
  string *description_local;
  string *name_local;
  TestContext *testCtx_local;
  BlockSingleStructCase *this_local;
  
  typeS._0_4_ = bufferMode;
  typeS._4_4_ = layoutFlags;
  _bufferMode_local = description;
  description_local = name;
  name_local = (string *)testCtx;
  testCtx_local = (TestContext *)this;
  UniformBlockCase::UniformBlockCase
            (&this->super_UniformBlockCase,testCtx,name,description,bufferMode,matrixLoadFlag,false)
  ;
  (this->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BlockSingleStructCase_016ab6a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"S",&local_59);
  pSVar1 = ShaderInterface::allocStruct(&(this->super_UniformBlockCase).m_interface,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  local_38 = pSVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"a",&local_91);
  VarType::VarType(&local_b0,TYPE_INT_VEC3,4);
  StructType::addMember(pSVar1,&local_90,&local_b0,0x1800);
  VarType::~VarType(&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  pSVar1 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"b",&local_d1);
  VarType::VarType(&local_108,TYPE_FLOAT_MAT3,2);
  VarType::VarType(&local_f0,&local_108,4);
  StructType::addMember(pSVar1,&local_d0,&local_f0,0);
  VarType::~VarType(&local_f0);
  VarType::~VarType(&local_108);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  pSVar1 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"c",&local_129);
  VarType::VarType((VarType *)&block,TYPE_FLOAT_VEC4,4);
  StructType::addMember(pSVar1,&local_128,(VarType *)&block,0);
  VarType::~VarType((VarType *)&block);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"Block",&local_171);
  pUVar2 = ShaderInterface::allocBlock(&(this->super_UniformBlockCase).m_interface,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  local_150 = pUVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"s",&local_1d9);
  VarType::VarType(&local_1f8,local_38,0);
  Uniform::Uniform(&local_1b8,&local_1d8,&local_1f8,0);
  UniformBlock::addUniform(pUVar2,&local_1b8);
  Uniform::~Uniform(&local_1b8);
  VarType::~VarType(&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  UniformBlock::setFlags(local_150,typeS._4_4_);
  pUVar2 = local_150;
  if (0 < numInstances) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"block",&local_219);
    UniformBlock::setInstanceName(pUVar2,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator(&local_219);
    UniformBlock::setArraySize(local_150,numInstances);
  }
  (*(this->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[2])()
  ;
  return;
}

Assistant:

BlockSingleStructCase (tcu::TestContext& testCtx, const std::string& name, const std::string& description, deUint32 layoutFlags, BufferMode bufferMode, int numInstances, MatrixLoadFlags matrixLoadFlag)
		: UniformBlockCase	(testCtx, name, description, bufferMode, matrixLoadFlag)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, PRECISION_HIGH), UNUSED_BOTH); // First member is unused.
		typeS.addMember("b", VarType(VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH));

		UniformBlock& block = m_interface.allocBlock("Block");
		block.addUniform(Uniform("s", VarType(&typeS), 0));
		block.setFlags(layoutFlags);

		if (numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(numInstances);
		}

		init();
	}